

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_description_abi_cxx11_(Formatter *this,App *app)

{
  bool bVar1;
  FormatterBase *this_00;
  FormatterBase *__lhs;
  App *in_RDX;
  string *in_RSI;
  string *in_RDI;
  size_t max_options;
  size_t min_options;
  string desc;
  App *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  string *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d9 [4];
  FormatterBase *local_58;
  FormatterBase *local_40;
  App *local_18;
  
  this_01 = in_RDI;
  local_18 = in_RDX;
  App::get_description_abi_cxx11_(in_stack_fffffffffffffd08);
  this_00 = (FormatterBase *)App::get_require_option_min(local_18);
  local_40 = this_00;
  __lhs = (FormatterBase *)App::get_require_option_max(local_18);
  local_58 = __lhs;
  bVar1 = App::get_required(local_18);
  if (bVar1) {
    in_stack_fffffffffffffd10 = local_d9;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
               (allocator<char> *)in_stack_fffffffffffffd40);
    FormatterBase::get_label(this_00,in_RSI);
    ::std::operator+((char *)__lhs,in_stack_fffffffffffffd10);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)in_stack_fffffffffffffd10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffd10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd08);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::allocator<char>::~allocator((allocator<char> *)local_d9);
  }
  if ((local_58 == local_40) && (local_40 != (FormatterBase *)0x0)) {
    if (local_40 == (FormatterBase *)0x1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08);
    }
    else {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd48);
      ::std::operator+((char *)__lhs,in_stack_fffffffffffffd10);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (char *)in_stack_fffffffffffffd10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffd10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd08);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    }
  }
  else if (local_58 == (FormatterBase *)0x0) {
    if (local_40 != (FormatterBase *)0x0) {
      std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd48);
      ::std::operator+((char *)__lhs,in_stack_fffffffffffffd10);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       (char *)in_stack_fffffffffffffd10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffffd10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd08);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
      ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    }
  }
  else if (local_40 == (FormatterBase *)0x0) {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd48);
    ::std::operator+((char *)__lhs,in_stack_fffffffffffffd10);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)in_stack_fffffffffffffd10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffd10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd08);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
  }
  else {
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd48);
    ::std::operator+((char *)__lhs,in_stack_fffffffffffffd10);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)in_stack_fffffffffffffd10);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffd48);
    ::std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                     (char *)in_stack_fffffffffffffd10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffffd10,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd08);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19395b);
  if (bVar1) {
    ::std::__cxx11::string::string(this_01);
  }
  else {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     (char *)in_RSI);
  }
  ::std::__cxx11::string::~string(in_stack_fffffffffffffd10);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();
    if(app->get_required()) {
        desc += " " + get_label("REQUIRED") + " ";
    }
    if((max_options == min_options) && (min_options > 0)) {
        if(min_options == 1) {
            desc += " \n[Exactly 1 of the following options is required]";
        } else {
            desc += " \n[Exactly " + std::to_string(min_options) + " options from the following list are required]";
        }
    } else if(max_options > 0) {
        if(min_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the follow options are required]";
        } else {
            desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
        }
    } else if(min_options > 0) {
        desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
    }
    return (!desc.empty()) ? desc + "\n" : std::string{};
}